

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void ssl_tls_trace(int direction,int ssl_ver,int content_type,void *buf,size_t len,SSL *ssl,
                  void *userp)

{
  Curl_easy *data;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *local_460;
  char unknown [32];
  char ssl_buf [1024];
  
  if (userp == (void *)0x0) {
    return;
  }
  data = *userp;
  if (data == (Curl_easy *)0x0) {
    return;
  }
  if ((data->set).fdebug == (curl_debug_callback)0x0) {
    return;
  }
  if (1 < (uint)direction) {
    return;
  }
  switch(ssl_ver) {
  case 0x300:
    local_460 = "SSLv3";
    break;
  case 0x301:
    local_460 = "TLSv1.0";
    break;
  case 0x302:
    local_460 = "TLSv1.1";
    break;
  case 0x303:
    local_460 = "TLSv1.2";
    break;
  case 0x304:
    local_460 = "TLSv1.3";
    break;
  default:
    if (ssl_ver == 0) goto LAB_004d37ab;
    if (ssl_ver == 2) {
      local_460 = "SSLv2";
    }
    else {
      local_460 = unknown;
      curl_msnprintf(local_460,0x20,"(%x)",(ulong)(uint)ssl_ver);
    }
  }
  if (content_type == 0 || (ssl_ver & 0xffffff00U) != 0x300) {
    uVar4 = (ulong)(uint)(int)*buf;
    pcVar3 = "";
    if ((ssl_ver & 0xffffff00U) == 0x300) goto LAB_004d3817;
    pcVar5 = "Unknown";
  }
  else {
    switch(content_type) {
    case 0x14:
      pcVar3 = "TLS change cipher";
      break;
    case 0x15:
      pcVar3 = "TLS alert";
      break;
    case 0x16:
      pcVar3 = "TLS handshake";
      break;
    case 0x17:
      pcVar3 = "TLS app data";
      break;
    default:
      if (content_type == 0x100) {
        pcVar3 = "TLS header";
      }
      else {
        pcVar3 = "TLS Unknown";
      }
    }
    uVar4 = (ulong)(uint)(int)*buf;
LAB_004d3817:
    switch(uVar4) {
    case 0:
      pcVar5 = "Hello request";
      break;
    case 1:
      pcVar5 = "Client hello";
      break;
    case 2:
      pcVar5 = "Server hello";
      break;
    default:
      pcVar5 = "Unknown";
      break;
    case 4:
      pcVar5 = "Newsession Ticket";
      break;
    case 0xb:
      pcVar5 = "Certificate";
      break;
    case 0xc:
      pcVar5 = "Server key exchange";
      break;
    case 0xd:
      pcVar5 = "Request CERT";
      break;
    case 0xe:
      pcVar5 = "Server finished";
      break;
    case 0xf:
      pcVar5 = "CERT verify";
      break;
    case 0x10:
      pcVar5 = "Client key exchange";
      break;
    case 0x14:
      pcVar5 = "Finished";
      break;
    case 0x16:
      pcVar5 = "Certificate Status";
    }
  }
  pcVar2 = "OUT";
  if (direction == 0) {
    pcVar2 = "IN";
  }
  iVar1 = curl_msnprintf(ssl_buf,0x400,"%s (%s), %s, %s (%d):\n",local_460,pcVar2,pcVar3,pcVar5,
                         uVar4);
  Curl_debug(data,CURLINFO_TEXT,ssl_buf,(long)iVar1,(connectdata *)0x0);
LAB_004d37ab:
  Curl_debug(data,(direction == 1) + CURLINFO_SSL_DATA_IN,(char *)buf,len,(connectdata *)0x0);
  return;
}

Assistant:

static void ssl_tls_trace(int direction, int ssl_ver, int content_type,
                          const void *buf, size_t len, SSL *ssl,
                          void *userp)
{
  struct Curl_easy *data;
  const char *msg_name, *tls_rt_name;
  char ssl_buf[1024];
  char unknown[32];
  int msg_type, txt_len;
  const char *verstr = NULL;
  struct connectdata *conn = userp;

  if(!conn || !conn->data || !conn->data->set.fdebug ||
     (direction != 0 && direction != 1))
    return;

  data = conn->data;

  switch(ssl_ver) {
#ifdef SSL2_VERSION /* removed in recent versions */
  case SSL2_VERSION:
    verstr = "SSLv2";
    break;
#endif
#ifdef SSL3_VERSION
  case SSL3_VERSION:
    verstr = "SSLv3";
    break;
#endif
  case TLS1_VERSION:
    verstr = "TLSv1.0";
    break;
#ifdef TLS1_1_VERSION
  case TLS1_1_VERSION:
    verstr = "TLSv1.1";
    break;
#endif
#ifdef TLS1_2_VERSION
  case TLS1_2_VERSION:
    verstr = "TLSv1.2";
    break;
#endif
#ifdef TLS1_3_VERSION
  case TLS1_3_VERSION:
    verstr = "TLSv1.3";
    break;
#endif
  case 0:
    break;
  default:
    snprintf(unknown, sizeof(unknown), "(%x)", ssl_ver);
    verstr = unknown;
    break;
  }

  if(ssl_ver) {
    /* the info given when the version is zero is not that useful for us */

    ssl_ver >>= 8; /* check the upper 8 bits only below */

    /* SSLv2 doesn't seem to have TLS record-type headers, so OpenSSL
     * always pass-up content-type as 0. But the interesting message-type
     * is at 'buf[0]'.
     */
    if(ssl_ver == SSL3_VERSION_MAJOR && content_type)
      tls_rt_name = tls_rt_type(content_type);
    else
      tls_rt_name = "";

    msg_type = *(char *)buf;
    msg_name = ssl_msg_type(ssl_ver, msg_type);

    txt_len = snprintf(ssl_buf, sizeof(ssl_buf), "%s (%s), %s, %s (%d):\n",
                       verstr, direction?"OUT":"IN",
                       tls_rt_name, msg_name, msg_type);
    Curl_debug(data, CURLINFO_TEXT, ssl_buf, (size_t)txt_len, NULL);
  }

  Curl_debug(data, (direction == 1) ? CURLINFO_SSL_DATA_OUT :
             CURLINFO_SSL_DATA_IN, (char *)buf, len, NULL);
  (void) ssl;
}